

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplaceRealloc<slang::IntervalMapDetails::Path::Entry>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,pointer pos,Entry *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  undefined8 uVar4;
  pointer pEVar5;
  pointer pEVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  pointer pEVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar3 = this->cap;
  if (uVar12 < uVar3 * 2) {
    uVar12 = uVar3 * 2;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    uVar12 = 0x7ffffffffffffff;
  }
  lVar13 = (long)pos - (long)this->data_;
  pEVar9 = (pointer)operator_new(uVar12 << 4);
  uVar4 = *(undefined8 *)&args->size;
  *(undefined8 *)((long)pEVar9 + lVar13) = args->node;
  ((undefined8 *)((long)pEVar9 + lVar13))[1] = uVar4;
  p = this->data_;
  lVar10 = this->len * 0x10;
  lVar11 = (long)p + (lVar10 - (long)pos);
  pEVar5 = p;
  pEVar6 = pEVar9;
  if (lVar11 == 0) {
    if (this->len != 0) {
      lVar11 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->node + lVar11);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pEVar9->node + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar11 = lVar11 + 0x10;
      } while (lVar10 != lVar11);
    }
  }
  else {
    for (; pEVar5 != pos; pEVar5 = pEVar5 + 1) {
      uVar7 = pEVar5->size;
      uVar8 = pEVar5->offset;
      pEVar6->node = pEVar5->node;
      pEVar6->size = uVar7;
      pEVar6->offset = uVar8;
      pEVar6 = pEVar6 + 1;
    }
    memcpy((void *)((long)pEVar9 + lVar13 + 0x10),pos,(lVar11 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar12;
  this->data_ = pEVar9;
  return (pointer)((long)pEVar9 + lVar13);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}